

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<std::__cxx11::list<int,_std::allocator<int>_>_>::
reject<std::__exception_ptr::exception_ptr>
          (PromiseResolver<std::__cxx11::list<int,_std::allocator<int>_>_> *this,
          exception_ptr *error)

{
  QPromise<std::__cxx11::list<int,_std::allocator<int>_>_> *pQVar1;
  Data *pDVar2;
  PromiseData<std::__cxx11::list<int,_std::allocator<int>_>_> *pPVar3;
  QPromise<std::__cxx11::list<int,_std::allocator<int>_>_> *promise;
  exception_ptr *error_local;
  PromiseResolver<std::__cxx11::list<int,_std::allocator<int>_>_> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::__cxx11::list<int,_std::allocator<int>_>_>::Data>
           ::operator->(&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<std::__cxx11::list<int,_std::allocator<int>_>_> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<std::__cxx11::list<int,_std::allocator<int>_>_>_>
             ::operator->(&(pQVar1->
                           super_QPromiseBase<std::__cxx11::list<int,_std::allocator<int>_>_>).m_d);
    PromiseDataBase<std::__cxx11::list<int,_std::allocator<int>_>,_void_(const_std::__cxx11::list<int,_std::allocator<int>_>_&)>
    ::reject<std::__exception_ptr::exception_ptr>
              (&pPVar3->
                super_PromiseDataBase<std::__cxx11::list<int,_std::allocator<int>_>,_void_(const_std::__cxx11::list<int,_std::allocator<int>_>_&)>
               ,error);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<std::__cxx11::list<int,_std::allocator<int>_>_>_>
             ::operator->(&(pQVar1->
                           super_QPromiseBase<std::__cxx11::list<int,_std::allocator<int>_>_>).m_d);
    PromiseDataBase<std::__cxx11::list<int,_std::allocator<int>_>,_void_(const_std::__cxx11::list<int,_std::allocator<int>_>_&)>
    ::dispatch(&pPVar3->
                super_PromiseDataBase<std::__cxx11::list<int,_std::allocator<int>_>,_void_(const_std::__cxx11::list<int,_std::allocator<int>_>_&)>
              );
    release(this);
  }
  return;
}

Assistant:

void reject(E&& error)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->reject(std::forward<E>(error));
            promise->m_d->dispatch();
            release();
        }
    }